

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

_Bool msgpack_unpacker_flush_zone(msgpack_unpacker *mpac)

{
  msgpack_zone *zone;
  msgpack_zone_finalizer *pmVar1;
  _Bool _Var2;
  void *pvVar3;
  int *data;
  
  pvVar3 = mpac->ctx;
  if (*(char *)((long)pvVar3 + 8) == '\x01') {
    data = (int *)mpac->buffer;
    zone = mpac->z;
    pmVar1 = (zone->finalizer_array).tail;
    if (pmVar1 == (zone->finalizer_array).end) {
      _Var2 = msgpack_zone_push_finalizer_expand(zone,decr_count,data);
      if (!_Var2) {
        return false;
      }
      data = (int *)mpac->buffer;
      pvVar3 = mpac->ctx;
    }
    else {
      pmVar1->func = decr_count;
      pmVar1->data = data;
      (zone->finalizer_array).tail = pmVar1 + 1;
    }
    *(undefined1 *)((long)pvVar3 + 8) = 0;
    LOCK();
    *data = *data + 1;
    UNLOCK();
  }
  return true;
}

Assistant:

bool msgpack_unpacker_flush_zone(msgpack_unpacker* mpac)
{
    if(CTX_REFERENCED(mpac)) {
        if(!msgpack_zone_push_finalizer(mpac->z, decr_count, mpac->buffer)) {
            return false;
        }
        CTX_REFERENCED(mpac) = false;

        incr_count(mpac->buffer);
    }

    return true;
}